

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

bool vk::isSrgbFormat(VkFormat format)

{
  TextureFormat TVar1;
  ChannelOrder local_18;
  VkFormat format_local;
  
  TVar1 = mapVkFormat(format);
  local_18 = TVar1.order;
  return local_18 - sR < 6;
}

Assistant:

bool isSrgbFormat (VkFormat format)
{
	switch (mapVkFormat(format).order)
	{
		case tcu::TextureFormat::sR:
		case tcu::TextureFormat::sRG:
		case tcu::TextureFormat::sRGB:
		case tcu::TextureFormat::sRGBA:
		case tcu::TextureFormat::sBGR:
		case tcu::TextureFormat::sBGRA:
			return true;

		default:
			return false;
	}
}